

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O1

void __thiscall
anurbs::TrimmedSurfaceClipping::compute_span
          (TrimmedSurfaceClipping *this,Index index_u,Index index_v,Interval span_u,Interval span_v)

{
  iterator iVar1;
  pointer pIVar2;
  PolyNode *pPVar3;
  _List_node_base *p_Var4;
  pointer this_00;
  bool bVar5;
  int iVar6;
  PolyNode *this_01;
  long lVar7;
  pointer ppPVar8;
  IntPoint *pt;
  pointer pIVar9;
  ulong uVar10;
  IntPoint *pt_1;
  Vector point;
  Paths clip;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> regions;
  Polygon region;
  Vector point_1;
  PolyTree polytree;
  Clipper clipper;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  local_2b8;
  Index local_298;
  Index local_290;
  Paths local_288;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> local_268;
  value_type local_248;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  Matrix<double,_1,_2,_1,_1,_2> local_1f8;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1e0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1c8;
  PolyTree local_1b0;
  undefined1 local_148 [136];
  ClipperBase local_c0;
  
  local_218 = span_v.m_t1;
  local_200 = span_v.m_t0;
  local_210 = span_u.m_t1;
  local_208 = span_u.m_t0;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = index_u;
  local_290 = index_v;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)local_288.
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x18);
  *(undefined8 *)
   local_288.
   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined8 *)
   ((long)local_288.
          super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = 0;
  *(undefined8 *)
   ((long)local_288.
          super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x10) = 0;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_288.
       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ClipperLib::PolyNode::PolyNode(&local_1b0.super_PolyNode);
  this_00 = local_288.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1b0.super_PolyNode._vptr_PolyNode = (_func_int **)&PTR__PolyTree_00384488;
  local_1b0.AllNodes.
  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.AllNodes.
  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.AllNodes.
  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._0_8_ = (undefined8)(local_208 / this->m_scale);
  local_148._8_8_ = (undefined8)(local_200 / this->m_scale);
  iVar1._M_current =
       *(IntPoint **)
        ((long)local_288.
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8);
  if (iVar1._M_current ==
      *(IntPoint **)
       ((long)local_288.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 0x10)) {
    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
    _M_realloc_insert<ClipperLib::IntPoint_const&>
              ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
               local_288.
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar1,(IntPoint *)local_148);
  }
  else {
    (iVar1._M_current)->X = local_148._0_8_;
    (iVar1._M_current)->Y = local_148._8_8_;
    *(long *)((long)local_288.
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8) =
         *(long *)((long)local_288.
                         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8) + 0x10;
  }
  local_248.outer_path.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)(local_210 / this->m_scale);
  local_248.outer_path.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(long)(local_200 / this->m_scale);
  iVar1._M_current = *(IntPoint **)((long)this_00 + 8);
  if (iVar1._M_current == *(IntPoint **)((long)this_00 + 0x10)) {
    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
    _M_realloc_insert<ClipperLib::IntPoint_const&>
              ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this_00,iVar1,
               (IntPoint *)&local_248);
  }
  else {
    (iVar1._M_current)->X =
         (cInt)local_248.outer_path.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    (iVar1._M_current)->Y =
         (cInt)local_248.outer_path.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *(long *)((long)this_00 + 8) = *(long *)((long)this_00 + 8) + 0x10;
  }
  local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(long)(local_210 / this->m_scale);
  local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(long)(local_218 / this->m_scale);
  iVar1._M_current = *(IntPoint **)((long)this_00 + 8);
  if (iVar1._M_current == *(IntPoint **)((long)this_00 + 0x10)) {
    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
    _M_realloc_insert<ClipperLib::IntPoint_const&>
              ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this_00,iVar1,
               (IntPoint *)&local_268);
  }
  else {
    (iVar1._M_current)->X =
         (cInt)local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (iVar1._M_current)->Y =
         (cInt)local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *(long *)((long)this_00 + 8) = *(long *)((long)this_00 + 8) + 0x10;
  }
  local_2b8.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)(local_208 / this->m_scale);
  local_2b8.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(long)(local_218 / this->m_scale);
  iVar1._M_current = *(IntPoint **)((long)this_00 + 8);
  if (iVar1._M_current == *(IntPoint **)((long)this_00 + 0x10)) {
    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
    _M_realloc_insert<ClipperLib::IntPoint_const&>
              ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this_00,iVar1,
               (IntPoint *)&local_2b8);
  }
  else {
    (iVar1._M_current)->X =
         (cInt)local_2b8.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    (iVar1._M_current)->Y =
         (cInt)local_2b8.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *(long *)((long)this_00 + 8) = *(long *)((long)this_00 + 8) + 0x10;
  }
  ClipperLib::Clipper::Clipper((Clipper *)local_148,0);
  ClipperLib::ClipperBase::AddPaths
            ((ClipperBase *)(*(_func_int **)(local_148._0_8_ + -0x18) + (long)local_148),
             &this->m_paths,ptSubject,true);
  ClipperLib::ClipperBase::AddPaths
            ((ClipperBase *)
             (*(_func_int **)(local_148._0_8_ + -0x18) +
             (long)&((Clipper *)local_148)->_vptr_Clipper),&local_288,ptClip,true);
  ClipperLib::Clipper::Execute((Clipper *)local_148,ctIntersection,&local_1b0,pftNonZero,pftNonZero)
  ;
  this_01 = ClipperLib::PolyTree::GetFirst(&local_1b0);
  local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = ClipperLib::PolyTree::Total(&local_1b0);
  if (iVar6 == 0) {
    lVar7 = ((long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4) * local_298;
    (this->m_span_trim_type).
    super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7 + local_290] = Empty;
    std::vector<anurbs::Polygon,std::allocator<anurbs::Polygon>>::
    _M_assign_aux<anurbs::Polygon_const*>
              ((vector<anurbs::Polygon,std::allocator<anurbs::Polygon>> *)
               ((this->m_span_polygons).
                super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar7 + local_290),0,0);
  }
  else {
    iVar6 = ClipperLib::PolyTree::Total(&local_1b0);
    if (iVar6 == 1) {
      if ((long)(this_01->Contour).
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this_01->Contour).
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x40) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_1c8,
                   local_288.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_1e0,&this_01->Contour);
        bVar5 = is_rect(&local_1c8,&local_1e0);
        if (local_1e0.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e0.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e0.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1c8.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar5 != false) {
        lVar7 = ((long)(this->m_spans_v).
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_spans_v).
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4) * local_298;
        (this->m_span_trim_type).
        super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7 + local_290] = Full;
        std::vector<anurbs::Polygon,std::allocator<anurbs::Polygon>>::
        _M_assign_aux<anurbs::Polygon_const*>
                  ((vector<anurbs::Polygon,std::allocator<anurbs::Polygon>> *)
                   ((this->m_span_polygons).
                    super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + local_290),0,0);
        if (bVar5 != false) goto LAB_001e22f9;
      }
    }
    for (; this_01 != (PolyNode *)0x0; this_01 = ClipperLib::PolyNode::GetNext(this_01)) {
      bVar5 = ClipperLib::PolyNode::IsHole(this_01);
      if (!bVar5) {
        local_248.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_248.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_248.outer_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_1,_2,_1,_1,_2> *)0x0;
        local_248.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.outer_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.outer_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_1,_2,_1,_1,_2> *)0x0;
        std::
        vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ::reserve(&local_248.outer_path,
                  (long)(this_01->Contour).
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_01->Contour).
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
        pIVar2 = (this_01->Contour).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pIVar9 = (this_01->Contour).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar2;
            pIVar9 = pIVar9 + 1) {
          local_2b8.
          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)((double)pIVar9->X * this->m_scale);
          local_2b8.
          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)((double)pIVar9->Y * this->m_scale);
          if (local_248.outer_path.
              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_248.outer_path.
              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
            ::_M_realloc_insert<Eigen::Matrix<double,1,2,1,1,2>>
                      ((vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
                        *)&local_248,
                       (iterator)
                       local_248.outer_path.
                       super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Matrix<double,_1,_2,_1,_1,_2> *)&local_2b8);
          }
          else {
            ((local_248.outer_path.
              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[0]
                 = (double)local_2b8.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            ((local_248.outer_path.
              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[1]
                 = (double)local_2b8.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
            local_248.outer_path.
            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_248.outer_path.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        ppPVar8 = (this_01->Childs).
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this_01->Childs).
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppPVar8) {
          uVar10 = 0;
          do {
            local_2b8.
            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2b8.
            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_1,_2,_1,_1,_2> *)0x0;
            local_2b8.
            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (Matrix<double,_1,_2,_1,_1,_2> *)0x0;
            std::
            vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ::reserve(&local_2b8,
                      (long)(ppPVar8[uVar10]->Contour).
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(ppPVar8[uVar10]->Contour).
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
            pPVar3 = (this_01->Childs).
                     super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10];
            pIVar2 = *(pointer *)
                      ((long)&(pPVar3->Contour).
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl + 8);
            for (pIVar9 = (pPVar3->Contour).
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar2;
                pIVar9 = pIVar9 + 1) {
              local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
              m_data.array[0] = (double)pIVar9->X * this->m_scale;
              local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
              m_data.array[1] = (double)pIVar9->Y * this->m_scale;
              if (local_2b8.
                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_2b8.
                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
                ::_M_realloc_insert<Eigen::Matrix<double,1,2,1,1,2>>
                          ((vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
                            *)&local_2b8,
                           (iterator)
                           local_2b8.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_1f8);
              }
              else {
                ((local_2b8.
                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
                [0] = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                      m_storage.m_data.array[0];
                ((local_2b8.
                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
                [1] = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                      m_storage.m_data.array[1];
                local_2b8.
                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_2b8.
                     super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            std::
            vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
            ::push_back(&local_248.inner_paths,&local_2b8);
            if (local_2b8.
                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2b8.
                              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_2b8.
                                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2b8.
                                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar10 = uVar10 + 1;
            ppPVar8 = (this_01->Childs).
                      super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar10 < (ulong)((long)(this_01->Childs).
                                          super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar8
                                   >> 3));
        }
        std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::push_back
                  (&local_268,&local_248);
        std::
        vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ::~vector(&local_248.inner_paths);
        if (local_248.outer_path.
            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_248.outer_path.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_248.outer_path.
                                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_248.outer_path.
                                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    lVar7 = ((long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4) * local_298;
    (this->m_span_trim_type).
    super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7 + local_290] = trimmed;
    std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=
              ((this->m_span_polygons).
               super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7 + local_290,&local_268);
  }
LAB_001e22f9:
  std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector(&local_268);
  local_148._0_8_ = &PTR_ExecuteInternal_0038baf0;
  local_c0._vptr_ClipperBase = (_func_int **)&PTR__Clipper_0038bb38;
  while ((_List_node_base *)local_148._88_8_ != (_List_node_base *)(local_148 + 0x58)) {
    p_Var4 = ((_List_node_base *)local_148._88_8_)->_M_next;
    operator_delete((void *)local_148._88_8_,0x18);
    local_148._88_8_ = p_Var4;
  }
  if ((pointer)local_148._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._56_8_,local_148._72_8_ - local_148._56_8_);
  }
  if ((pointer)local_148._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._32_8_,local_148._48_8_ - local_148._32_8_);
  }
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._8_8_,local_148._24_8_ - local_148._8_8_);
  }
  ClipperLib::ClipperBase::~ClipperBase(&local_c0);
  ClipperLib::PolyTree::~PolyTree(&local_1b0);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_288);
  return;
}

Assistant:

void compute_span(const Index index_u, const Index index_v, const Interval span_u, const Interval span_v)
    {
        ClipperLib::Paths clip(1);
        ClipperLib::PolyTree polytree;

        clip[0] << to_int_pt(span_u.t0(), span_v.t0())
                << to_int_pt(span_u.t1(), span_v.t0())
                << to_int_pt(span_u.t1(), span_v.t1())
                << to_int_pt(span_u.t0(), span_v.t1());

        ClipperLib::Clipper clipper;
        clipper.AddPaths(m_paths, ClipperLib::ptSubject, true);
        clipper.AddPaths(clip, ClipperLib::ptClip, true);
        clipper.Execute(ClipperLib::ctIntersection, polytree,
            ClipperLib::pftNonZero, ClipperLib::pftNonZero);

        ClipperLib::PolyNode* polynode = polytree.GetFirst();

        std::vector<Polygon> regions;

        if (polytree.Total() == 0) {
            span_trim_type(index_u, index_v) = TrimTypes::Empty;
            span_polygons(index_u, index_v) = {};
            return;
        }

        if (polytree.Total() == 1) {
            const auto& contour = polynode->Contour;

            if (contour.size() == 4 && is_rect(clip[0], contour)) {
                span_trim_type(index_u, index_v) = TrimTypes::Full;
                span_polygons(index_u, index_v) = {};
                return;
            }
        }

        while (polynode) {
            if (!polynode->IsHole()) {
                const auto& outer_contour = polynode->Contour;
                const auto& inner_contours = polynode->Childs;

                Polygon region;

                region.outer_path.reserve(outer_contour.size());

                for (const auto& pt : outer_contour) {
                    region.outer_path.push_back(from_int_pt(pt));
                }

                for (std::size_t i = 0; i < inner_contours.size(); i++) {
                    typename Polygon::Path inner_path;

                    inner_path.reserve(inner_contours[i]->Contour.size());

                    for (const auto& pt : inner_contours[i]->Contour) {
                        inner_path.push_back(from_int_pt(pt));
                    }

                    region.inner_paths.push_back(inner_path);
                }

                regions.push_back(region);
            }

            polynode = polynode->GetNext();
        }

        span_trim_type(index_u, index_v) = TrimTypes::trimmed;
        span_polygons(index_u, index_v) = regions;
    }